

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::
SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::insert
          (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *this,
          TypedID<(diligent_spirv_cross::Types)0> *itr,
          TypedID<(diligent_spirv_cross::Types)0> *insert_begin,
          TypedID<(diligent_spirv_cross::Types)0> *insert_end)

{
  size_t *psVar1;
  TypedID<(diligent_spirv_cross::Types)0> *__ptr;
  uint32_t *puVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *pAVar6;
  long lVar7;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar8;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *pAVar13;
  size_t __n;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar14;
  
  uVar10 = (long)insert_end - (long)insert_begin >> 2;
  __ptr = (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
          ptr;
  sVar11 = (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
           buffer_size;
  pTVar14 = __ptr + sVar11;
  sVar11 = sVar11 + uVar10;
  if (pTVar14 == itr) {
    reserve(this,sVar11);
    if (insert_end != insert_begin) {
      sVar11 = (this->
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
               buffer_size;
      pTVar14 = (this->
                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
                ptr;
      lVar12 = 0;
      do {
        pTVar14[sVar11 + lVar12].id = insert_begin[lVar12].id;
        lVar12 = lVar12 + 1;
      } while (uVar10 + (uVar10 == 0) != lVar12);
    }
  }
  else if (this->buffer_capacity < sVar11) {
    uVar3 = 8;
    if (8 < sVar11) {
      uVar3 = sVar11;
    }
    do {
      uVar5 = uVar3;
      uVar3 = uVar5 * 2;
    } while (uVar5 < uVar10);
    if (uVar5 < 9) {
      pAVar6 = &this->stack_storage;
    }
    else {
      pAVar6 = (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)
               malloc(uVar5 * 4);
    }
    if (pAVar6 == (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                   *)0x0) {
      ::std::terminate();
    }
    pTVar8 = __ptr;
    pAVar13 = pAVar6;
    if (__ptr != itr &&
        pAVar6 != (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                   *)__ptr) {
      do {
        *(uint32_t *)pAVar13->aligned_char = pTVar8->id;
        pTVar8 = pTVar8 + 1;
        pAVar13 = (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                   *)((long)pAVar13->aligned_char + 4);
      } while (pTVar8 != itr);
    }
    pTVar9 = insert_begin;
    if (insert_begin != insert_end) {
      do {
        *(uint32_t *)pAVar13->aligned_char = pTVar9->id;
        pTVar9 = pTVar9 + 1;
        pAVar13 = (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                   *)((long)pAVar13->aligned_char + 4);
      } while (pTVar9 != insert_end);
    }
    if (pTVar8 != pTVar14 &&
        (insert_begin != insert_end ||
        pAVar6 != (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                   *)__ptr)) {
      do {
        *(uint32_t *)pAVar13->aligned_char = pTVar8->id;
        pTVar8 = pTVar8 + 1;
        pAVar13 = (AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>
                   *)((long)pAVar13->aligned_char + 4);
      } while (pTVar8 != pTVar14);
    }
    if ((AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)__ptr
        != &this->stack_storage) {
      free(__ptr);
    }
    (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).ptr =
         (TypedID<(diligent_spirv_cross::Types)0> *)pAVar6;
    this->buffer_capacity = uVar5;
  }
  else {
    lVar12 = ((long)insert_end - (long)insert_begin) + (long)pTVar14;
    if (pTVar14 != itr && insert_end != insert_begin) {
      lVar4 = 0;
      do {
        lVar7 = lVar4;
        *(undefined4 *)(lVar12 + -4 + lVar7) = *(undefined4 *)((long)&pTVar14[-1].id + lVar7);
        if ((long)insert_begin + (4 - (long)insert_end) == lVar7) break;
        lVar4 = lVar7 + -4;
      } while ((TypedID<(diligent_spirv_cross::Types)0> *)((long)&pTVar14[-1].id + lVar7) != itr);
      pTVar14 = (TypedID<(diligent_spirv_cross::Types)0> *)((long)&pTVar14[-1].id + lVar7);
      lVar12 = lVar12 + lVar7 + -4;
    }
    __n = (long)pTVar14 - (long)itr;
    if (__n != 0) {
      memmove((void *)(lVar12 - __n),itr,__n);
    }
    pTVar14 = (this->
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).ptr
              + (this->
                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>).
                buffer_size;
    if (insert_begin != insert_end && pTVar14 != itr) {
      do {
        puVar2 = &insert_begin->id;
        insert_begin = insert_begin + 1;
        itr->id = *puVar2;
        itr = itr + 1;
        if (itr == pTVar14) break;
      } while (insert_begin != insert_end);
    }
    for (; insert_begin != insert_end; insert_begin = insert_begin + 1) {
      itr->id = insert_begin->id;
      itr = itr + 1;
    }
  }
  psVar1 = &(this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>)
            .buffer_size;
  *psVar1 = *psVar1 + uVar10;
  return;
}

Assistant:

void insert(T *itr, const T *insert_begin, const T *insert_end) SPIRV_CROSS_NOEXCEPT
	{
		auto count = size_t(insert_end - insert_begin);
		if (itr == this->end())
		{
			reserve(this->buffer_size + count);
			for (size_t i = 0; i < count; i++, insert_begin++)
				new (&this->ptr[this->buffer_size + i]) T(*insert_begin);
			this->buffer_size += count;
		}
		else
		{
			if (this->buffer_size + count > buffer_capacity)
			{
				auto target_capacity = this->buffer_size + count;
				if (target_capacity == 0)
					target_capacity = 1;
				if (target_capacity < N)
					target_capacity = N;

				while (target_capacity < count)
					target_capacity <<= 1u;

				// Need to allocate new buffer. Move everything to a new buffer.
				T *new_buffer =
				    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

				// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
				if (!new_buffer)
					std::terminate();

				// First, move elements from source buffer to new buffer.
				// We don't deal with types which can throw in move constructor.
				auto *target_itr = new_buffer;
				auto *original_source_itr = this->begin();

				if (new_buffer != this->ptr)
				{
					while (original_source_itr != itr)
					{
						new (target_itr) T(std::move(*original_source_itr));
						original_source_itr->~T();
						++original_source_itr;
						++target_itr;
					}
				}

				// Copy-construct new elements.
				for (auto *source_itr = insert_begin; source_itr != insert_end; ++source_itr, ++target_itr)
					new (target_itr) T(*source_itr);

				// Move over the other half.
				if (new_buffer != this->ptr || insert_begin != insert_end)
				{
					while (original_source_itr != this->end())
					{
						new (target_itr) T(std::move(*original_source_itr));
						original_source_itr->~T();
						++original_source_itr;
						++target_itr;
					}
				}

				if (this->ptr != stack_storage.data())
					free(this->ptr);
				this->ptr = new_buffer;
				buffer_capacity = target_capacity;
			}
			else
			{
				// Move in place, need to be a bit careful about which elements are constructed and which are not.
				// Move the end and construct the new elements.
				auto *target_itr = this->end() + count;
				auto *source_itr = this->end();
				while (target_itr != this->end() && source_itr != itr)
				{
					--target_itr;
					--source_itr;
					new (target_itr) T(std::move(*source_itr));
				}

				// For already constructed elements we can move-assign.
				std::move_backward(itr, source_itr, target_itr);

				// For the inserts which go to already constructed elements, we can do a plain copy.
				while (itr != this->end() && insert_begin != insert_end)
					*itr++ = *insert_begin++;

				// For inserts into newly allocated memory, we must copy-construct instead.
				while (insert_begin != insert_end)
				{
					new (itr) T(*insert_begin);
					++itr;
					++insert_begin;
				}
			}

			this->buffer_size += count;
		}
	}